

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_multigrad
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *grad,REF_INT p_norm,REF_DBL gradation,
          REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  REF_DBL *scalar;
  REF_DBL *grad_00;
  REF_DBL *grad_01;
  REF_DBL *grad_02;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL *gradz;
  REF_DBL *grady;
  REF_DBL *gradx;
  REF_DBL *dsdx;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL target_complexity_local;
  REF_DBL gradation_local;
  REF_INT p_norm_local;
  REF_DBL *grad_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x996,
           "ref_metric_multigrad","malloc dsdx of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x996,"ref_metric_multigrad","malloc dsdx of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < pRVar1->max;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        scalar[ref_malloc_init_i_2] = 0.0;
      }
      if (pRVar1->max * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x997,"ref_metric_multigrad","malloc gradx of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        grad_00 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
        if (grad_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x997,"ref_metric_multigrad","malloc gradx of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0;
              SBORROW4(ref_malloc_init_i_3,pRVar1->max * 3) !=
              ref_malloc_init_i_3 + pRVar1->max * -3 < 0;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            grad_00[ref_malloc_init_i_3] = 0.0;
          }
          if (pRVar1->max * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x998,"ref_metric_multigrad","malloc grady of REF_DBL negative");
            metric_local._4_4_ = 1;
          }
          else {
            grad_01 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
            if (grad_01 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x998,"ref_metric_multigrad","malloc grady of REF_DBL NULL");
              metric_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss = 0;
                  SBORROW4(ref_private_macro_code_rss,pRVar1->max * 3) !=
                  ref_private_macro_code_rss + pRVar1->max * -3 < 0;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                grad_01[ref_private_macro_code_rss] = 0.0;
              }
              if (pRVar1->max * 3 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x999,"ref_metric_multigrad","malloc gradz of REF_DBL negative");
                metric_local._4_4_ = 1;
              }
              else {
                grad_02 = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
                if (grad_02 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x999,"ref_metric_multigrad","malloc gradz of REF_DBL NULL");
                  metric_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_1 = 0;
                      SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 3) !=
                      ref_private_macro_code_rss_1 + pRVar1->max * -3 < 0;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    grad_02[ref_private_macro_code_rss_1] = 0.0;
                  }
                  for (dsdx._0_4_ = 0; (int)dsdx < pRVar1->max; dsdx._0_4_ = (int)dsdx + 1) {
                    if (((-1 < (int)dsdx) && ((int)dsdx < pRVar1->max)) &&
                       (-1 < pRVar1->global[(int)dsdx])) {
                      scalar[(int)dsdx] = grad[(int)dsdx * 3];
                    }
                  }
                  metric_local._4_4_ = ref_recon_l2_projection_grad(ref_grid,scalar,grad_00);
                  if (metric_local._4_4_ == 0) {
                    for (dsdx._0_4_ = 0; (int)dsdx < pRVar1->max; dsdx._0_4_ = (int)dsdx + 1) {
                      if (((-1 < (int)dsdx) && ((int)dsdx < pRVar1->max)) &&
                         (-1 < pRVar1->global[(int)dsdx])) {
                        scalar[(int)dsdx] = grad[(int)dsdx * 3 + 1];
                      }
                    }
                    metric_local._4_4_ = ref_recon_l2_projection_grad(ref_grid,scalar,grad_01);
                    if (metric_local._4_4_ == 0) {
                      for (dsdx._0_4_ = 0; (int)dsdx < pRVar1->max; dsdx._0_4_ = (int)dsdx + 1) {
                        if (((-1 < (int)dsdx) && ((int)dsdx < pRVar1->max)) &&
                           (-1 < pRVar1->global[(int)dsdx])) {
                          scalar[(int)dsdx] = grad[(int)dsdx * 3 + 2];
                        }
                      }
                      metric_local._4_4_ = ref_recon_l2_projection_grad(ref_grid,scalar,grad_02);
                      if (metric_local._4_4_ == 0) {
                        for (dsdx._0_4_ = 0; (int)dsdx < pRVar1->max; dsdx._0_4_ = (int)dsdx + 1) {
                          if (((-1 < (int)dsdx) && ((int)dsdx < pRVar1->max)) &&
                             (-1 < pRVar1->global[(int)dsdx])) {
                            metric[(int)dsdx * 6] = grad_00[(int)dsdx * 3];
                            metric[(int)dsdx * 6 + 1] =
                                 (grad_00[(int)dsdx * 3 + 1] + grad_01[(int)dsdx * 3]) * 0.5;
                            metric[(int)dsdx * 6 + 2] =
                                 (grad_00[(int)dsdx * 3 + 2] + grad_02[(int)dsdx * 3]) * 0.5;
                            metric[(int)dsdx * 6 + 3] = grad_01[(int)dsdx * 3 + 1];
                            metric[(int)dsdx * 6 + 4] =
                                 (grad_01[(int)dsdx * 3 + 2] + grad_02[(int)dsdx * 3 + 1]) * 0.5;
                            metric[(int)dsdx * 6 + 5] = grad_02[(int)dsdx * 3 + 2];
                          }
                        }
                        if (grad_02 != (REF_DBL *)0x0) {
                          free(grad_02);
                        }
                        if (grad_01 != (REF_DBL *)0x0) {
                          free(grad_01);
                        }
                        if (grad_00 != (REF_DBL *)0x0) {
                          free(grad_00);
                        }
                        if (scalar != (REF_DBL *)0x0) {
                          free(scalar);
                        }
                        metric_local._4_4_ = ref_recon_abs_value_hessian(ref_grid,metric);
                        if (metric_local._4_4_ == 0) {
                          metric_local._4_4_ = ref_recon_roundoff_limit(metric,ref_grid);
                          if (metric_local._4_4_ == 0) {
                            metric_local._4_4_ = ref_metric_local_scale(metric,ref_grid,p_norm);
                            if (metric_local._4_4_ == 0) {
                              metric_local._4_4_ =
                                   ref_metric_gradation_at_complexity
                                             (metric,ref_grid,gradation,target_complexity);
                              if (metric_local._4_4_ == 0) {
                                metric_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0x9bc,"ref_metric_multigrad",(ulong)metric_local._4_4_,
                                       "gradation at complexity");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0x9b9,"ref_metric_multigrad",(ulong)metric_local._4_4_,
                                     "local scale lp norm");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0x9b8,"ref_metric_multigrad",(ulong)metric_local._4_4_,
                                   "floor metric eigenvalues based on grid size and solution jitter"
                                  );
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0x9b5,"ref_metric_multigrad",(ulong)metric_local._4_4_,"abs");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x9a4,"ref_metric_multigrad",(ulong)metric_local._4_4_,"gradz");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x9a0,"ref_metric_multigrad",(ulong)metric_local._4_4_,"grady");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x99c,"ref_metric_multigrad",(ulong)metric_local._4_4_,"gradx");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_multigrad(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *grad, REF_INT p_norm,
                                        REF_DBL gradation,
                                        REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL *dsdx, *gradx, *grady, *gradz;
  ref_malloc_init(dsdx, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradx, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grady, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradz, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  i = 0;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradx), "gradx");

  i = 1;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, grady), "grady");

  i = 2;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradz), "gradz");

  /* average off-diagonals */
  each_ref_node_valid_node(ref_node, node) {
    metric[0 + 6 * node] = gradx[0 + 3 * node];
    metric[1 + 6 * node] = 0.5 * (gradx[1 + 3 * node] + grady[0 + 3 * node]);
    metric[2 + 6 * node] = 0.5 * (gradx[2 + 3 * node] + gradz[0 + 3 * node]);
    metric[3 + 6 * node] = grady[1 + 3 * node];
    metric[4 + 6 * node] = 0.5 * (grady[2 + 3 * node] + gradz[1 + 3 * node]);
    metric[5 + 6 * node] = gradz[2 + 3 * node];
  }

  ref_free(gradz);
  ref_free(grady);
  ref_free(gradx);
  ref_free(dsdx);

  RSS(ref_recon_abs_value_hessian(ref_grid, metric), "abs");

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}